

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void __thiscall crnlib::task_pool::process_task(task_pool *this,task *tsk)

{
  atomic32_t *paVar1;
  long lVar2;
  task_callback_func p_Var3;
  
  p_Var3 = (tsk->field_2).m_callback;
  if ((tsk->m_flags & 1) == 0) {
    (*p_Var3)(tsk->m_data,tsk->m_pData_ptr);
  }
  else {
    (*(code *)**(undefined8 **)p_Var3)(p_Var3,tsk->m_data);
  }
  LOCK();
  paVar1 = &this->m_total_completed_tasks;
  lVar2 = *paVar1;
  *paVar1 = *paVar1 + 1;
  UNLOCK();
  if (lVar2 + 1 == this->m_total_submitted_tasks) {
    semaphore::try_release(&this->m_all_tasks_completed,1);
    return;
  }
  return;
}

Assistant:

void task_pool::process_task(task& tsk) {
  if (tsk.m_flags & cTaskFlagObject)
    tsk.m_pObj->execute_task(tsk.m_data, tsk.m_pData_ptr);
  else
    tsk.m_callback(tsk.m_data, tsk.m_pData_ptr);

  if (atomic_increment32(&m_total_completed_tasks) == m_total_submitted_tasks) {
    // Try to signal the semaphore (the max count is 1 so this may actually fail).
    m_all_tasks_completed.try_release();
  }
}